

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfArguments.c
# Opt level: O1

void sbfArguments_destroy(sbfArguments a)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0x20;
  do {
    free(*(void **)(a->mOptions + lVar1 * 8));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x11f);
  if (a->mArgumentsSize != 0) {
    uVar2 = 0;
    do {
      free(a->mArguments[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < a->mArgumentsSize);
  }
  free(a->mArguments);
  free(a);
  return;
}

Assistant:

void
sbfArguments_destroy (sbfArguments a)
{
    u_int i;

    for (i = 0; i < SBF_ARRAYSIZE (a->mOptions); i++)
        free ((void*)a->mValues[i]);

    for (i = 0; i < a->mArgumentsSize; i++)
        free ((void*)a->mArguments[i]);
    free (a->mArguments);

    free (a);
}